

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOcontroller.h
# Opt level: O1

void IOcontroller::write_budget_order_seeds
               (string *outFileName,TResult *resultObj,string *outFolder,Graph *graph)

{
  pointer pcVar1;
  undefined8 uVar2;
  string *psVar3;
  long *plVar4;
  ostream *poVar5;
  long *plVar6;
  ulong uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> outpath;
  Nodelist vecSeed_inf_cost;
  Nodelist vecSeed_inf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  ofstream outFile_inf_cost;
  ofstream outFile_inf;
  long *local_4f0;
  long local_4e8;
  long local_4e0;
  long lStack_4d8;
  long *local_4d0;
  long local_4c8;
  long local_4c0;
  long lStack_4b8;
  long *local_4b0;
  long local_4a8;
  long local_4a0 [2];
  Graph *local_490;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_488;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_470;
  long *local_458 [2];
  long local_448 [2];
  string *local_438;
  long *local_430;
  long local_428;
  long local_420;
  long lStack_418;
  ios_base aiStack_338 [264];
  long *local_230;
  filebuf local_228 [240];
  ios_base aiStack_138 [264];
  
  local_490 = graph;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_470,&resultObj->__VecSeed_inf);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_488,&resultObj->__VecSeed_inf_cost);
  mkdir((outFolder->_M_dataplus)._M_p,0x1db);
  local_4b0 = local_4a0;
  pcVar1 = (outFolder->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4b0,pcVar1,pcVar1 + outFolder->_M_string_length);
  std::__cxx11::string::append((char *)&local_4b0);
  mkdir((char *)local_4b0,0x1db);
  local_4f0 = &local_4e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4f0,local_4b0,(long)local_4b0 + local_4a8);
  std::__cxx11::string::append((char *)&local_4f0);
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_4f0,(ulong)(outFileName->_M_dataplus)._M_p);
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_4c0 = *plVar6;
    lStack_4b8 = plVar4[3];
    local_4d0 = &local_4c0;
  }
  else {
    local_4c0 = *plVar6;
    local_4d0 = (long *)*plVar4;
  }
  local_4c8 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_4d0);
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_420 = *plVar6;
    lStack_418 = plVar4[3];
    local_430 = &local_420;
  }
  else {
    local_420 = *plVar6;
    local_430 = (long *)*plVar4;
  }
  local_428 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::ofstream::ofstream(&local_230,(string *)&local_430,_S_out);
  if (local_430 != &local_420) {
    operator_delete(local_430,local_420 + 1);
  }
  local_438 = outFileName;
  if (local_4d0 != &local_4c0) {
    operator_delete(local_4d0,local_4c0 + 1);
  }
  if (local_4f0 != &local_4e0) {
    operator_delete(local_4f0,local_4e0 + 1);
  }
  if (local_470.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_470.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar7 = 0;
    do {
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      local_430 = (long *)CONCAT71(local_430._1_7_,10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_430,1);
      uVar7 = uVar7 + 1;
    } while (uVar7 < (ulong)((long)local_470.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_470.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 2));
  }
  std::ofstream::close();
  local_458[0] = local_448;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_458,local_4b0,(long)local_4b0 + local_4a8);
  psVar3 = local_438;
  std::__cxx11::string::append((char *)local_458);
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_458,(ulong)(psVar3->_M_dataplus)._M_p);
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_4e0 = *plVar6;
    lStack_4d8 = plVar4[3];
    local_4f0 = &local_4e0;
  }
  else {
    local_4e0 = *plVar6;
    local_4f0 = (long *)*plVar4;
  }
  local_4e8 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_4f0);
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_4c0 = *plVar6;
    lStack_4b8 = plVar4[3];
    local_4d0 = &local_4c0;
  }
  else {
    local_4c0 = *plVar6;
    local_4d0 = (long *)*plVar4;
  }
  local_4c8 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::ofstream::ofstream(&local_430,(string *)&local_4d0,_S_out);
  if (local_4d0 != &local_4c0) {
    operator_delete(local_4d0,local_4c0 + 1);
  }
  if (local_4f0 != &local_4e0) {
    operator_delete(local_4f0,local_4e0 + 1);
  }
  if (local_458[0] != local_448) {
    operator_delete(local_458[0],local_448[0] + 1);
  }
  if (local_488.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_488.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar7 = 0;
    do {
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&local_430);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      local_4d0 = (long *)CONCAT71(local_4d0._1_7_,10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_4d0,1);
      uVar7 = uVar7 + 1;
    } while (uVar7 < (ulong)((long)local_488.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_488.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 2));
  }
  std::ofstream::close();
  uVar2 = _sqrt;
  plVar4 = _VTT;
  local_430 = _VTT;
  *(undefined8 *)((long)&local_430 + _VTT[-3]) = _sqrt;
  std::filebuf::~filebuf((filebuf *)&local_428);
  std::ios_base::~ios_base(aiStack_338);
  local_230 = plVar4;
  *(undefined8 *)(local_228 + plVar4[-3] + -8) = uVar2;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(aiStack_138);
  if (local_4b0 != local_4a0) {
    operator_delete(local_4b0,local_4a0[0] + 1);
  }
  if (local_488.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_488.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_488.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_488.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_470.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_470.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_470.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_470.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

static void write_budget_order_seeds(const std::string & outFileName, const TResult & resultObj,
            const std::string & outFolder, const Graph & graph) {
        auto vecSeed_inf = resultObj.get_seed_inf_vec();
        auto vecSeed_inf_cost = resultObj.get_seed_inf_cost_vec();
        mkdir_absence(outFolder.c_str());
        const auto outpath = outFolder + "/seed";
        mkdir_absence(outpath.c_str());
        std::ofstream outFile_inf(outpath + "/seed_" + outFileName + "_inf");
        for (auto i = 0; i < vecSeed_inf.size(); i++)
        {
            outFile_inf << vecSeed_inf[i] << " " << graph[i].size() << '\n';
        }
        outFile_inf.close();
        std::ofstream outFile_inf_cost(outpath + "/seed_" + outFileName + "_inf_cost");
        for (auto i = 0; i < vecSeed_inf_cost.size(); i++)
        {
            outFile_inf_cost << vecSeed_inf_cost[i] << " " << graph[i].size() << '\n';
        }
        outFile_inf_cost.close();
    }